

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

bool __thiscall
duckdb::BitpackingState<short,_short>::Flush<duckdb::EmptyBitpackingWriter>
          (BitpackingState<short,_short> *this)

{
  short sVar1;
  short *psVar2;
  ushort uVar3;
  bool bVar4;
  ushort uVar5;
  unsigned_long uVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  byte bVar10;
  byte bVar11;
  ulong uVar12;
  bool bVar13;
  ulong uVar14;
  
  bVar13 = true;
  if (this->compression_buffer_idx != 0) {
    if (((this->all_invalid == false) && (this->maximum != this->minimum)) ||
       (1 < (byte)(this->mode - AUTO))) {
      psVar2 = &this->min_max_diff;
      bVar4 = TrySubtractOperator::Operation<short,short,short>(this->maximum,this->minimum,psVar2);
      this->can_do_for = bVar4;
      CalculateDeltaStats(this);
      if (this->can_do_delta == true) {
        sVar1 = this->minimum_delta;
        if ((this->maximum_delta == sVar1) && ((this->mode & ~AUTO) != DELTA_FOR)) {
          this->total_size = this->total_size + 8;
          return true;
        }
        uVar8 = (uint)(ushort)this->min_max_delta_diff;
        if (this->min_max_delta_diff == 0) {
          bVar7 = 0;
        }
        else {
          bVar10 = 0;
          do {
            bVar10 = bVar10 + 1;
            uVar5 = (ushort)uVar8;
            uVar8 = (uint)(int)(short)uVar5 >> 1;
          } while (1 < uVar5);
          bVar7 = 0x10;
          if (bVar10 < 0xf) {
            bVar7 = bVar10;
          }
        }
        uVar5 = *psVar2;
        if (uVar5 == 0) {
          bVar10 = 0;
        }
        else {
          bVar10 = 0x10;
          if (uVar5 != 0x8000) {
            uVar3 = -uVar5;
            if (0 < (short)uVar5) {
              uVar3 = uVar5;
            }
            uVar8 = (uint)uVar3;
            bVar11 = 1;
            do {
              bVar11 = bVar11 + 1;
              uVar5 = (ushort)uVar8;
              uVar8 = (uint)(int)(short)uVar5 >> 1;
            } while (1 < uVar5);
            bVar10 = 0x10;
            if (bVar11 < 0xf) {
              bVar10 = bVar11;
            }
          }
        }
        bVar4 = this->mode != FOR;
        if (bVar4 && bVar7 < bVar10) {
          uVar14 = this->compression_buffer_idx;
          if (uVar14 != 0) {
            uVar9 = 0;
            do {
              this->delta_buffer[uVar9] = this->delta_buffer[uVar9] - sVar1;
              uVar9 = uVar9 + 1;
            } while (uVar14 != uVar9);
          }
          this->total_size = this->total_size + 0xc;
          if ((uVar14 & 0x1f) != 0) {
            uVar6 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar14 & 0x1f);
            uVar14 = (uVar14 - uVar6) + 0x20;
          }
          this->total_size = this->total_size + (bVar7 * uVar14 >> 3);
          if (bVar4 && bVar7 < bVar10) {
            return true;
          }
        }
      }
      if (this->can_do_for == true) {
        uVar8 = (uint)(ushort)*psVar2;
        if (*psVar2 == 0) {
          uVar14 = 0;
        }
        else {
          bVar7 = 0;
          do {
            bVar7 = bVar7 + 1;
            uVar5 = (ushort)uVar8;
            uVar8 = (uint)(int)(short)uVar5 >> 1;
          } while (1 < uVar5);
          bVar10 = 0x10;
          if (bVar7 < 0xf) {
            bVar10 = bVar7;
          }
          uVar14 = (ulong)bVar10;
        }
        uVar9 = this->compression_buffer_idx;
        if (uVar9 != 0) {
          psVar2 = this->compression_buffer;
          sVar1 = this->minimum;
          uVar12 = 0;
          do {
            psVar2[uVar12] = psVar2[uVar12] - sVar1;
            uVar12 = uVar12 + 1;
          } while (uVar9 != uVar12);
        }
        if ((uVar9 & 0x1f) != 0) {
          uVar6 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar9 & 0x1f);
          uVar9 = (uVar9 - uVar6) + 0x20;
        }
        this->total_size = this->total_size + (uVar9 * uVar14 >> 3) + 10;
      }
      else {
        bVar13 = false;
      }
    }
    else {
      this->total_size = this->total_size + 6;
    }
  }
  return bVar13;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}